

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledHorizontal.cpp
# Opt level: O1

DecoratorDataHandle __thiscall
Rml::DecoratorTiledHorizontal::GenerateElementData
          (DecoratorTiledHorizontal *this,Element *element,BoxArea paint_area)

{
  undefined1 *this_00;
  undefined1 *this_01;
  Geometry *pGVar1;
  void *pvVar2;
  Vector2f surface_origin;
  Vector2f surface_origin_00;
  Vector2f surface_dimensions;
  Element *element_00;
  undefined8 uVar3;
  undefined4 uVar4;
  uint num_textures;
  ComputedValues *computed;
  DecoratorTiledHorizontalData *this_02;
  long lVar5;
  float fVar6;
  float minimum_width;
  float fVar7;
  Texture texture;
  Vector2f right_dimensions;
  Vector2f left_dimensions;
  Vector2f centre_dimensions;
  Mesh mesh [3];
  RenderBox render_box;
  Vector2f local_190;
  Element *local_188;
  Vector2f local_180;
  Vector2f local_178;
  undefined8 uStack_170;
  Vector2f local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  Tile *local_130;
  _Bit_iterator_base local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  Vector2f local_108;
  Vector2Type VStack_100;
  Mesh local_f8 [3];
  RenderBox local_60;
  
  lVar5 = 0x30;
  local_188 = element;
  do {
    texture = Decorator::GetTexture
                        ((Decorator *)this,
                         *(int *)((long)&(this->super_DecoratorTiled).super_Decorator.
                                         _vptr_Decorator + lVar5));
    DecoratorTiled::Tile::CalculateDimensions
              ((Tile *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5)
               ,texture);
    element_00 = local_188;
    lVar5 = lVar5 + 0x4c;
  } while (lVar5 != 0x114);
  Element::GetRenderBox(&local_60,local_188,paint_area,0);
  local_128 = (_Bit_iterator_base)ZEXT416((uint)local_60.border_widths._M_elems[3]);
  local_148 = ZEXT416((uint)local_60.border_widths._M_elems[0]);
  local_108.y = local_60.border_widths._M_elems[0];
  local_108.x = local_60.border_widths._M_elems[3];
  VStack_100.x = 0;
  VStack_100.y = 0;
  local_178 = local_60.fill_size;
  uStack_170 = 0;
  this_00 = &this->field_0x30;
  local_180 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_00,element_00);
  local_130 = (Tile *)&this->field_0x7c;
  local_190 = DecoratorTiled::Tile::GetNaturalDimensions(local_130,element_00);
  this_01 = &this->field_0xc8;
  local_160 = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_01,element_00);
  local_118 = local_178.y;
  fStack_114 = local_178.y;
  fStack_110 = local_178.y;
  fStack_10c = local_178.y;
  DecoratorTiled::ScaleTileDimensions(&this->super_DecoratorTiled,&local_180,local_178.y,Vertical);
  DecoratorTiled::ScaleTileDimensions(&this->super_DecoratorTiled,&local_190,local_118,Vertical);
  DecoratorTiled::ScaleTileDimensions(&this->super_DecoratorTiled,&local_160,local_118,Vertical);
  fVar6 = Math::Round(local_180.x);
  local_180.x = fVar6;
  fVar6 = Math::Round(local_190.x);
  fVar7 = fVar6 + local_180.x;
  if (local_178.x < fVar7) {
    local_180.x = (local_180.x / fVar7) * local_178.x;
    fVar6 = (fVar6 / fVar7) * local_178.x;
  }
  local_190.x = fVar6;
  computed = Element::GetComputedValues(local_188);
  memset(local_f8,0,0x90);
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_00,local_f8 + *(int *)this_00,computed,local_108,local_180,local_180);
  local_148._0_4_ = (float)local_148._0_4_ + 0.0;
  surface_origin.y = (float)local_148._0_4_;
  surface_origin.x = local_128._M_p._0_4_ + local_180.x;
  surface_dimensions.y = local_160.y;
  surface_dimensions.x = local_178.x - (local_180.x + local_190.x);
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_01,local_f8 + *(int *)this_01,computed,surface_origin,surface_dimensions,
             local_160);
  surface_origin_00.y = (float)local_148._0_4_;
  surface_origin_00.x = local_128._M_p._0_4_ + (local_178.x - local_190.x);
  DecoratorTiled::Tile::GenerateGeometry
            (local_130,local_f8 + local_130->texture_index,computed,surface_origin_00,local_190,
             local_190);
  num_textures = Decorator::GetNumTextures((Decorator *)this);
  this_02 = (DecoratorTiledHorizontalData *)operator_new(0x10);
  DecoratorTiledHorizontalData::DecoratorTiledHorizontalData(this_02,num_textures);
  local_178 = (Vector2f)Element::GetRenderManager(local_188);
  if (0 < (int)num_textures) {
    lVar5 = 0;
    do {
      RenderManager::MakeGeometry((RenderManager *)local_158,(Mesh *)local_178);
      pGVar1 = this_02->geometry;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)((long)&(pGVar1->
                                    super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                    ).render_manager + lVar5));
      uVar4 = local_158._8_4_;
      uVar3 = local_158._0_8_;
      local_158._0_8_ = (RenderInterface *)0x0;
      *(undefined8 *)
       ((long)&(pGVar1->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).render_manager + lVar5) = uVar3;
      local_158._8_4_ = 0xffffffff;
      *(undefined4 *)
       ((long)&(pGVar1->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).resource_handle + lVar5) = uVar4;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)local_158);
      lVar5 = lVar5 + 0x10;
    } while ((ulong)num_textures << 4 != lVar5);
  }
  lVar5 = 0x90;
  do {
    pvVar2 = *(void **)((long)&fStack_110 + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)local_f8 + lVar5 + -8) - (long)pvVar2);
    }
    pvVar2 = *(void **)((long)&local_128._M_p + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&local_118 + lVar5) - (long)pvVar2);
    }
    lVar5 = lVar5 + -0x30;
  } while (lVar5 != 0);
  return (DecoratorDataHandle)this_02;
}

Assistant:

DecoratorDataHandle DecoratorTiledHorizontal::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tiles for this element.
	for (int i = 0; i < 3; i++)
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector2f left_dimensions = tiles[LEFT].GetNaturalDimensions(element);
	Vector2f right_dimensions = tiles[RIGHT].GetNaturalDimensions(element);
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);

	// Scale the tile sizes by the height scale.
	ScaleTileDimensions(left_dimensions, size.y, Axis::Vertical);
	ScaleTileDimensions(right_dimensions, size.y, Axis::Vertical);
	ScaleTileDimensions(centre_dimensions, size.y, Axis::Vertical);

	// Round the outer tile widths now so that we don't get gaps when rounding again in GenerateGeometry.
	left_dimensions.x = Math::Round(left_dimensions.x);
	right_dimensions.x = Math::Round(right_dimensions.x);

	// Shrink the x-sizes on the left and right tiles if necessary.
	if (size.x < left_dimensions.x + right_dimensions.x)
	{
		float minimum_width = left_dimensions.x + right_dimensions.x;
		left_dimensions.x = size.x * (left_dimensions.x / minimum_width);
		right_dimensions.x = size.x * (right_dimensions.x / minimum_width);
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	tiles[LEFT].GenerateGeometry(mesh[tiles[LEFT].texture_index], computed, offset, left_dimensions, left_dimensions);

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(left_dimensions.x, 0),
		Vector2f(size.x - (left_dimensions.x + right_dimensions.x), centre_dimensions.y), centre_dimensions);

	tiles[RIGHT].GenerateGeometry(mesh[tiles[RIGHT].texture_index], computed, offset + Vector2f(size.x - right_dimensions.x, 0), right_dimensions,
		right_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledHorizontalData* data = new DecoratorTiledHorizontalData(num_textures);
	RenderManager* render_manager = element->GetRenderManager();

	// Set the mesh and textures on the geometry.
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}